

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O3

int string_cmp_string(http_string_t string_a,http_string_t string_b)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = 0;
  if (string_a.len == string_b.len) {
    if ((int)(uint)string_a.len < 1) {
      uVar2 = 1;
    }
    else if (*string_a.value == *string_b.value) {
      uVar4 = (ulong)((uint)string_a.len & 0x7fffffff);
      uVar1 = 1;
      do {
        uVar3 = uVar1;
        if (uVar4 == uVar3) break;
        uVar1 = uVar3 + 1;
      } while (string_a.value[uVar3] == string_b.value[uVar3]);
      uVar2 = (uint)(uVar4 <= uVar3);
    }
  }
  return uVar2;
}

Assistant:

int string_cmp_string(http_string_t string_a, http_string_t string_b) {
    return string_a.len == string_b.len && nh_string_cmp(string_a.value, string_b.value, string_a.len);
}